

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pass.cpp
# Opt level: O3

bool __thiscall spvtools::opt::MemPass::RemoveUnreachableBlocks(MemPass *this,Function *func)

{
  BasicBlock *pBVar1;
  pointer puVar2;
  long lVar3;
  long *plVar4;
  BasicBlock *pBVar5;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> _Var6;
  Function *pFVar7;
  char cVar8;
  Instruction *pIVar9;
  ulong uVar10;
  pointer puVar11;
  undefined8 uVar12;
  Instruction *pIVar13;
  bool bVar14;
  __node_gen_type __node_gen;
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  reachable_blocks;
  queue<spvtools::opt::BasicBlock_*,_std::deque<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
  worklist;
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  visited_blocks;
  _Any_data local_150;
  code *local_140;
  code *local_138;
  MemPass *local_130;
  Function *local_128;
  BasicBlock *local_120;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> local_118;
  MemPass *local_110;
  code *local_108;
  code *local_100;
  Instruction *local_f8;
  undefined1 local_f0 [40];
  Instruction *local_c8;
  __node_base_ptr p_Stack_c0;
  _Deque_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> local_b8;
  _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  local_f0._0_8_ = local_f0 + 0x30;
  local_f0._8_8_ =
       (__uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
        )0x1;
  local_f0._16_8_ = (_Hash_node_base *)0x0;
  local_f0._24_8_ = (_func_int **)0x0;
  local_f0._32_4_ = 1.0;
  local_c8 = (Instruction *)0x0;
  p_Stack_c0 = (__node_base_ptr)0x0;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_130 = this;
  std::_Deque_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
  _M_initialize_map(&local_b8,0);
  local_118._M_head_impl =
       *(BasicBlock **)
        &(((func->blocks_).
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
         ._M_t;
  local_150._M_unused._M_object = local_f0;
  std::
  _Hashtable<spvtools::opt::BasicBlock*,spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>,std::__detail::_Identity,std::equal_to<spvtools::opt::BasicBlock*>,std::hash<spvtools::opt::BasicBlock*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_insert<spvtools::opt::BasicBlock*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::BasicBlock*,false>>>>
            ((_Hashtable<spvtools::opt::BasicBlock*,spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>,std::__detail::_Identity,std::equal_to<spvtools::opt::BasicBlock*>,std::hash<spvtools::opt::BasicBlock*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)local_150._M_unused._0_8_,&local_118,&local_150);
  local_150._M_unused._0_8_ =
       (undefined8)
       (((func->blocks_).
         super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
       super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
       ._M_t;
  local_128 = func;
  std::deque<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>::
  emplace_back<spvtools::opt::BasicBlock*>
            ((deque<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>> *)
             &local_b8,(BasicBlock **)&local_150);
  if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_b8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      pBVar1 = (BasicBlock *)
               ((IntrusiveNodeBase<spvtools::opt::Instruction> *)
               local_b8._M_impl.super__Deque_impl_data._M_start._M_cur)->_vptr_IntrusiveNodeBase;
      if ((unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           *)local_b8._M_impl.super__Deque_impl_data._M_start._M_cur ==
          &(((pointer)((long)local_b8._M_impl.super__Deque_impl_data._M_start._M_last + -0x30))->
           words).large_data_) {
        operator_delete(local_b8._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
        local_b8._M_impl.super__Deque_impl_data._M_start._M_cur =
             (_Elt_pointer)
             ((OperandData *)((long)local_b8._M_impl.super__Deque_impl_data._M_start._M_node + 8))->
             _vptr_SmallVector;
        local_b8._M_impl.super__Deque_impl_data._M_start._M_last =
             (_Elt_pointer)
             ((long)&(((pointer)
                      ((long)local_b8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x1c0))->
                     operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl + 8);
        local_b8._M_impl.super__Deque_impl_data._M_start._M_first =
             local_b8._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_b8._M_impl.super__Deque_impl_data._M_start._M_node =
             (_Map_pointer)((long)local_b8._M_impl.super__Deque_impl_data._M_start._M_node + 8);
      }
      else {
        local_b8._M_impl.super__Deque_impl_data._M_start._M_cur =
             (_Elt_pointer)
             &((IntrusiveNodeBase<spvtools::opt::Instruction> *)
              local_b8._M_impl.super__Deque_impl_data._M_start._M_cur)->next_node_;
      }
      local_150._8_8_ = 0;
      local_150._M_unused._M_object = operator_new(0x20);
      *(undefined1 **)local_150._M_unused._0_8_ = local_f0;
      *(_Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        **)((long)local_150._M_unused._0_8_ + 8) = &local_68;
      *(deque<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>> **)
       ((long)local_150._M_unused._0_8_ + 0x10) =
           (deque<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>> *)&local_b8
      ;
      *(MemPass **)((long)local_150._M_unused._0_8_ + 0x18) = local_130;
      local_138 = std::
                  _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/mem_pass.cpp:429:25)>
                  ::_M_invoke;
      local_140 = std::
                  _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/mem_pass.cpp:429:25)>
                  ::_M_manager;
      BasicBlock::ForEachSuccessorLabel(pBVar1,(function<void_(unsigned_int)> *)&local_150);
      if (local_140 != (code *)0x0) {
        (*local_140)(&local_150,&local_150,__destroy_functor);
      }
      local_150._8_8_ = (pointer)0x0;
      local_150._M_unused._M_object = operator_new(0x20);
      (((_Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
         *)&((BasicBlock *)local_150._M_unused._0_8_)->function_)->_M_impl).super__Vector_impl_data.
      _M_start = (pointer)local_f0;
      (((BasicBlock *)local_150._M_unused._0_8_)->label_)._M_t.
      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ._M_t = (tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
              )&local_68;
      (((BasicBlock *)local_150._M_unused._0_8_)->insts_).
      super_IntrusiveList<spvtools::opt::Instruction>._vptr_IntrusiveList = (_func_int **)&local_b8;
      (((BasicBlock *)local_150._M_unused._0_8_)->insts_).
      super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
      super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase =
           (_func_int **)local_130;
      local_138 = std::
                  _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/mem_pass.cpp:429:25)>
                  ::_M_invoke;
      local_140 = std::
                  _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/mem_pass.cpp:429:25)>
                  ::_M_manager;
      BasicBlock::ForMergeAndContinueLabel(pBVar1,(function<void_(unsigned_int)> *)&local_150);
      if (local_140 != (code *)0x0) {
        (*local_140)(&local_150,&local_150,__destroy_functor);
      }
    } while (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_b8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  puVar11 = (local_128->blocks_).
            super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (local_128->blocks_).
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar11 != puVar2) {
    local_120 = (BasicBlock *)&local_128->blocks_;
LAB_0025880a:
    pBVar1 = (puVar11->_M_t).
             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
    lVar3 = *(long *)(local_f0._0_8_ + ((ulong)pBVar1 % (ulong)local_f0._8_8_) * 8);
    if (lVar3 != 0) {
      plVar4 = *(long **)lVar3;
      pBVar5 = (BasicBlock *)plVar4[1];
      do {
        if (pBVar1 == pBVar5) {
          local_118._M_head_impl = (BasicBlock *)local_f0;
          local_110 = local_130;
          local_100 = std::
                      _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/mem_pass.cpp:463:26)>
                      ::_M_invoke;
          local_108 = std::
                      _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/mem_pass.cpp:463:26)>
                      ::_M_manager;
          local_150._8_8_ = 0;
          local_150._M_unused._M_object = &local_118;
          local_138 = std::
                      _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h:332:7)>
                      ::_M_invoke;
          local_140 = std::
                      _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h:332:7)>
                      ::_M_manager;
          pIVar9 = *(Instruction **)
                    ((long)&(pBVar1->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10)
          ;
          if ((pIVar9 == (Instruction *)0x0) ||
             ((pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false))
          goto LAB_00258911;
          goto LAB_002588bf;
        }
        plVar4 = (long *)*plVar4;
      } while ((plVar4 != (long *)0x0) &&
              (pBVar5 = (BasicBlock *)plVar4[1],
              (ulong)pBVar5 % (ulong)local_f0._8_8_ == (ulong)pBVar1 % (ulong)local_f0._8_8_));
    }
    goto LAB_00258937;
  }
LAB_002589fa:
  bVar14 = false;
LAB_002589fd:
  std::_Deque_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
  ~_Deque_base(&local_b8);
  std::
  _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  std::
  _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_f0);
  return bVar14;
  while( true ) {
    pIVar13 = (pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    if ((pIVar13->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
      pIVar13 = (Instruction *)0x0;
    }
    if (pIVar9->opcode_ != OpPhi) break;
    local_f8 = pIVar9;
    if (local_140 == (code *)0x0) {
      std::__throw_bad_function_call();
    }
    cVar8 = (*local_138)(&local_150,(uint *)&local_f8);
    pIVar9 = pIVar13;
    if (cVar8 == '\0') break;
LAB_002588bf:
    if (pIVar9 == (Instruction *)0x0) break;
  }
  if (local_140 != (code *)0x0) {
LAB_00258911:
    (*local_140)(&local_150,&local_150,__destroy_functor);
  }
  if (local_108 != (code *)0x0) {
    (*local_108)(&local_118,&local_118,3);
  }
LAB_00258937:
  pBVar1 = local_120;
  pFVar7 = local_128;
  puVar11 = puVar11 + 1;
  if (puVar11 == puVar2) goto code_r0x00258944;
  goto LAB_0025880a;
code_r0x00258944:
  local_150._8_8_ =
       (local_128->blocks_).
       super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  puVar11 = (local_128->blocks_).
            super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_150._M_unused._M_object = local_120;
  if ((pointer)local_150._8_8_ != puVar11) {
    bVar14 = false;
    uVar12 = local_120;
    do {
      uVar10 = (ulong)*(tuple<spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                        *)local_150._8_8_ % (ulong)local_f0._8_8_;
      lVar3 = *(long *)(local_f0._0_8_ + uVar10 * 8);
      if (lVar3 != 0) {
        plVar4 = *(long **)lVar3;
        _Var6._M_head_impl =
             *(BasicBlock **)
              &((tuple<spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                 *)(plVar4 + 1))->
               super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
        ;
        do {
          if ((_Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
               )*(tuple<spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                  *)local_150._8_8_ ==
              (_Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
               )_Var6._M_head_impl) {
            local_150._8_8_ = local_150._8_8_ + 8;
            goto LAB_002589ee;
          }
          plVar4 = (long *)*plVar4;
        } while ((plVar4 != (long *)0x0) &&
                (_Var6._M_head_impl =
                      ((_Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> *)(plVar4 + 1))->
                      _M_head_impl, (ulong)_Var6._M_head_impl % (ulong)local_f0._8_8_ == uVar10));
      }
      RemoveBlock(local_130,(iterator *)&local_150);
      puVar11 = (pFVar7->blocks_).
                super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      bVar14 = true;
      uVar12 = local_150._M_unused._0_8_;
LAB_002589ee:
    } while (((BasicBlock *)uVar12 != pBVar1) || ((pointer)local_150._8_8_ != puVar11));
    goto LAB_002589fd;
  }
  goto LAB_002589fa;
}

Assistant:

bool MemPass::RemoveUnreachableBlocks(Function* func) {
  bool modified = false;

  // Mark reachable all blocks reachable from the function's entry block.
  std::unordered_set<BasicBlock*> reachable_blocks;
  std::unordered_set<BasicBlock*> visited_blocks;
  std::queue<BasicBlock*> worklist;
  reachable_blocks.insert(func->entry().get());

  // Initially mark the function entry point as reachable.
  worklist.push(func->entry().get());

  auto mark_reachable = [&reachable_blocks, &visited_blocks, &worklist,
                         this](uint32_t label_id) {
    auto successor = cfg()->block(label_id);
    if (visited_blocks.count(successor) == 0) {
      reachable_blocks.insert(successor);
      worklist.push(successor);
      visited_blocks.insert(successor);
    }
  };

  // Transitively mark all blocks reachable from the entry as reachable.
  while (!worklist.empty()) {
    BasicBlock* block = worklist.front();
    worklist.pop();

    // All the successors of a live block are also live.
    static_cast<const BasicBlock*>(block)->ForEachSuccessorLabel(
        mark_reachable);

    // All the Merge and ContinueTarget blocks of a live block are also live.
    block->ForMergeAndContinueLabel(mark_reachable);
  }

  // Update operands of Phi nodes that reference unreachable blocks.
  for (auto& block : *func) {
    // If the block is about to be removed, don't bother updating its
    // Phi instructions.
    if (reachable_blocks.count(&block) == 0) {
      continue;
    }

    // If the block is reachable and has Phi instructions, remove all
    // operands from its Phi instructions that reference unreachable blocks.
    // If the block has no Phi instructions, this is a no-op.
    block.ForEachPhiInst([&reachable_blocks, this](Instruction* phi) {
      RemovePhiOperands(phi, reachable_blocks);
    });
  }

  // Erase unreachable blocks.
  for (auto ebi = func->begin(); ebi != func->end();) {
    if (reachable_blocks.count(&*ebi) == 0) {
      RemoveBlock(&ebi);
      modified = true;
    } else {
      ++ebi;
    }
  }

  return modified;
}